

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O1

void __thiscall
Assimp::SplitLargeMeshesProcess_Vertex::SplitMesh
          (SplitLargeMeshesProcess_Vertex *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  pointer *ppaVar1;
  uint *puVar2;
  undefined8 *puVar3;
  pointer *pppVar4;
  uint uVar5;
  aiVector3D *paVar6;
  iterator __position;
  long *plVar7;
  aiBone *paVar8;
  long lVar9;
  iterator iVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  pointer paVar27;
  pointer paVar28;
  uint c_2;
  int iVar29;
  uint uVar30;
  VertexWeightTable *pVVar31;
  aiVertexWeight aVar32;
  void *pvVar33;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *this_00;
  uint *puVar34;
  ulong *puVar35;
  uint uVar36;
  ulong *puVar37;
  ulong uVar38;
  uint c;
  long lVar39;
  pointer ppVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  bool bVar44;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> avWasCopied;
  undefined8 *local_4c8;
  vector<aiFace,_std::allocator<aiFace>_> local_498;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  char *local_458;
  vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>> *local_450
  ;
  ulong local_448;
  SplitLargeMeshesProcess_Vertex *local_440;
  undefined1 local_438 [8];
  uint *puStack_430;
  
  if (this->LIMIT < pMesh->mNumVertices) {
    pVVar31 = ComputeVertexBoneWeightTable(pMesh);
    uVar43 = pMesh->mNumVertices;
    uVar5 = this->LIMIT;
    local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_438._0_4_ = 0xffffffff;
    local_440 = this;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_478,(ulong)uVar43,(value_type_conflict1 *)local_438);
    uVar42 = (ulong)pMesh->mNumFaces / (ulong)(uVar43 / uVar5 + 1);
    local_448 = (ulong)(uint)((int)(uVar42 >> 3) + (int)uVar42);
    local_458 = (pMesh->mName).data;
    uVar43 = 0;
    local_450 = (vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                 *)avList;
    do {
      uVar5 = local_440->LIMIT;
      aVar32 = (aiVertexWeight)operator_new(0x520);
      *(undefined8 *)aVar32 = 0;
      *(uint *)((long)aVar32 + 8) = 0;
      memset((uint *)((long)aVar32 + 0x10),0,0xcc);
      ((uint *)((long)aVar32 + 0xe0))[0] = 0;
      ((uint *)((long)aVar32 + 0xe0))[1] = 0;
      ((uint *)((long)aVar32 + 0xe8))[0] = 0;
      ((uint *)((long)aVar32 + 0xe8))[1] = 0;
      *(undefined1 *)((long)aVar32 + 0xf0) = 0;
      memset((void *)((long)aVar32 + 0xf1),0x1b,0x3ff);
      *(uint *)((long)aVar32 + 0x4f0) = 0;
      ((uint *)((long)aVar32 + 0x4f8))[0] = 0;
      ((uint *)((long)aVar32 + 0x4f8))[1] = 0;
      ((uint *)((long)aVar32 + 0x500))[0] = 0;
      ((uint *)((long)aVar32 + 0x500))[1] = 0;
      ((uint *)((long)aVar32 + 0x508))[0] = 0;
      ((uint *)((long)aVar32 + 0x508))[1] = 0;
      ((uint *)((long)aVar32 + 0x510))[0] = 0;
      ((uint *)((long)aVar32 + 0x510))[1] = 0;
      *(uint *)((long)aVar32 + 0x518) = 0;
      ((uint *)((long)aVar32 + 0x70))[0] = 0;
      ((uint *)((long)aVar32 + 0x70))[1] = 0;
      ((uint *)((long)aVar32 + 0x78))[0] = 0;
      ((uint *)((long)aVar32 + 0x78))[1] = 0;
      ((uint *)((long)aVar32 + 0x80))[0] = 0;
      ((uint *)((long)aVar32 + 0x80))[1] = 0;
      ((uint *)((long)aVar32 + 0x88))[0] = 0;
      ((uint *)((long)aVar32 + 0x88))[1] = 0;
      ((uint *)((long)aVar32 + 0x90))[0] = 0;
      ((uint *)((long)aVar32 + 0x90))[1] = 0;
      ((uint *)((long)aVar32 + 0x98))[0] = 0;
      ((uint *)((long)aVar32 + 0x98))[1] = 0;
      ((uint *)((long)aVar32 + 0xa0))[0] = 0;
      ((uint *)((long)aVar32 + 0xa0))[1] = 0;
      ((uint *)((long)aVar32 + 0xa8))[0] = 0;
      ((uint *)((long)aVar32 + 0xa8))[1] = 0;
      ((uint *)((long)aVar32 + 0xb0))[0] = 0;
      ((uint *)((long)aVar32 + 0xb0))[1] = 0;
      ((uint *)((long)aVar32 + 0xb8))[0] = 0;
      ((uint *)((long)aVar32 + 0xb8))[1] = 0;
      ((uint *)((long)aVar32 + 0xc0))[0] = 0;
      ((uint *)((long)aVar32 + 0xc0))[1] = 0;
      ((uint *)((long)aVar32 + 200))[0] = 0;
      ((uint *)((long)aVar32 + 200))[1] = 0;
      ((uint *)((long)aVar32 + 0x30))[0] = 0;
      ((uint *)((long)aVar32 + 0x30))[1] = 0;
      ((uint *)((long)aVar32 + 0x38))[0] = 0;
      ((uint *)((long)aVar32 + 0x38))[1] = 0;
      ((uint *)((long)aVar32 + 0x40))[0] = 0;
      ((uint *)((long)aVar32 + 0x40))[1] = 0;
      ((uint *)((long)aVar32 + 0x48))[0] = 0;
      ((uint *)((long)aVar32 + 0x48))[1] = 0;
      ((uint *)((long)aVar32 + 0x50))[0] = 0;
      ((uint *)((long)aVar32 + 0x50))[1] = 0;
      ((uint *)((long)aVar32 + 0x58))[0] = 0;
      ((uint *)((long)aVar32 + 0x58))[1] = 0;
      ((uint *)((long)aVar32 + 0x60))[0] = 0;
      ((uint *)((long)aVar32 + 0x60))[1] = 0;
      ((uint *)((long)aVar32 + 0x68))[0] = 0;
      ((uint *)((long)aVar32 + 0x68))[1] = 0;
      *(uint *)((long)aVar32 + 4) = 0;
      *(uint *)((long)aVar32 + 0xe8) = pMesh->mMaterialIndex;
      if (aVar32 != (aiVertexWeight)pMesh) {
        uVar30 = (pMesh->mName).length;
        *(uint *)((long)aVar32 + 0xec) = uVar30;
        memcpy((uint *)((long)aVar32 + 0xf0),local_458,(ulong)uVar30);
        *(undefined1 *)((long)((long)aVar32 + 0xf0) + (ulong)uVar30) = 0;
      }
      puVar2 = (uint *)((long)aVar32 + 0xe0);
      if (pMesh->mNumBones != 0 && pMesh->mBones != (aiBone **)0x0) {
        uVar42 = (ulong)pMesh->mNumBones << 3;
        pvVar33 = operator_new__(uVar42);
        *(void **)puVar2 = pvVar33;
        memset(pvVar33,0,uVar42);
      }
      if ((uVar43 != 0) &&
         (local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        memset(local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0xff,
               ((long)local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                (-4 - (long)local_478.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
      }
      local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar30 = pMesh->mNumVertices;
      uVar42 = (ulong)uVar5;
      if (uVar30 != 0 && pMesh->mVertices != (aiVector3D *)0x0) {
        pvVar33 = operator_new__(uVar42 * 0xc);
        if (uVar5 != 0) {
          memset(pvVar33,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(void **)((long)aVar32 + 0x10) = pvVar33;
      }
      if (pMesh->mNormals != (aiVector3D *)0x0 && uVar30 != 0) {
        pvVar33 = operator_new__(uVar42 * 0xc);
        if (uVar5 != 0) {
          memset(pvVar33,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(void **)((long)aVar32 + 0x18) = pvVar33;
      }
      if ((pMesh->mBitangents != (aiVector3D *)0x0 && pMesh->mTangents != (aiVector3D *)0x0) &&
          uVar30 != 0) {
        pvVar33 = operator_new__(uVar42 * 0xc);
        if (uVar5 != 0) {
          memset(pvVar33,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(void **)((long)aVar32 + 0x20) = pvVar33;
        pvVar33 = operator_new__(uVar42 * 0xc);
        if (uVar5 != 0) {
          memset(pvVar33,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(void **)((long)aVar32 + 0x28) = pvVar33;
      }
      if (uVar30 != 0) {
        lVar39 = 0;
        do {
          if (pMesh->mColors[lVar39] == (aiColor4D *)0x0) break;
          pvVar33 = operator_new__(uVar42 << 4);
          if (uVar5 != 0) {
            memset(pvVar33,0,uVar42 << 4);
          }
          *(void **)((uint *)((long)aVar32 + 0x30) + lVar39 * 2) = pvVar33;
          lVar39 = lVar39 + 1;
        } while (lVar39 != 8);
      }
      if (uVar30 != 0) {
        lVar39 = 0;
        do {
          if (*(long *)((long)pMesh->mTextureCoords + lVar39 * 2) == 0) break;
          *(undefined4 *)((long)((long)aVar32 + 0xb0) + lVar39) =
               *(undefined4 *)((long)pMesh->mNumUVComponents + lVar39);
          pvVar33 = operator_new__(uVar42 * 0xc);
          if (uVar5 != 0) {
            memset(pvVar33,0,((uVar42 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(void **)((long)((long)aVar32 + 0x70) + lVar39 * 2) = pvVar33;
          lVar39 = lVar39 + 4;
        } while (lVar39 != 0x20);
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::reserve(&local_498,local_448);
      uVar42 = (ulong)uVar43;
      do {
        if (pMesh->mNumFaces <= (uint)uVar42) break;
        uVar43 = pMesh->mFaces[uVar42].mNumIndices;
        uVar41 = (ulong)uVar43;
        if (uVar41 == 0) {
          iVar29 = 0;
        }
        else {
          uVar38 = 0;
          iVar29 = 0;
          do {
            iVar29 = iVar29 + (uint)(local_478.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [pMesh->mFaces[uVar42].mIndices[uVar38]] == 0xffffffff);
            uVar38 = uVar38 + 1;
          } while (uVar41 != uVar38);
        }
        if (uVar5 < iVar29 + *(uint *)((long)aVar32 + 4)) {
          bVar44 = false;
        }
        else {
          local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffff00000000);
          puStack_430 = (uint *)0x0;
          std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                    (&local_498,(aiFace *)local_438);
          if (puStack_430 != (uint *)0x0) {
            operator_delete__(puStack_430);
          }
          paVar27 = local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].mNumIndices = uVar43;
          puVar34 = (uint *)operator_new__(uVar41 * 4);
          paVar27[-1].mIndices = puVar34;
          uVar36 = paVar27[-1].mNumIndices - 1;
          uVar30 = 8;
          if (uVar36 < 3) {
            uVar30 = *(uint *)(&DAT_001f0cb0 + (ulong)uVar36 * 4);
          }
          *(uint *)aVar32 = uVar30 | *(uint *)aVar32;
          if (uVar43 != 0) {
            uVar38 = 0;
            do {
              uVar43 = pMesh->mFaces[uVar42].mIndices[uVar38];
              if (local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar43] == 0xffffffff) {
                paVar6 = pMesh->mVertices;
                lVar39 = *(long *)((long)aVar32 + 0x10);
                uVar30 = *(uint *)((long)aVar32 + 4);
                *(float *)(lVar39 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar43].z;
                *(undefined8 *)(lVar39 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar43);
                paVar6 = pMesh->mNormals;
                if ((paVar6 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                  lVar39 = *(long *)((long)aVar32 + 0x18);
                  uVar30 = *(uint *)((long)aVar32 + 4);
                  *(float *)(lVar39 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar43].z;
                  *(undefined8 *)(lVar39 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar43);
                }
                paVar6 = pMesh->mTangents;
                if (((paVar6 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
                   (pMesh->mNumVertices != 0)) {
                  lVar39 = *(long *)((long)aVar32 + 0x20);
                  uVar30 = *(uint *)((long)aVar32 + 4);
                  *(float *)(lVar39 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar43].z;
                  *(undefined8 *)(lVar39 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar43);
                  paVar6 = pMesh->mBitangents;
                  lVar39 = *(long *)((long)aVar32 + 0x28);
                  uVar30 = *(uint *)((long)aVar32 + 4);
                  *(float *)(lVar39 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar43].z;
                  *(undefined8 *)(lVar39 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar43);
                }
                lVar39 = 0;
                do {
                  if ((pMesh->mTextureCoords[lVar39] != (aiVector3D *)0x0) &&
                     (pMesh->mNumVertices != 0)) {
                    paVar6 = pMesh->mTextureCoords[lVar39];
                    lVar9 = *(long *)((uint *)((long)aVar32 + 0x70) + lVar39 * 2);
                    uVar30 = *(uint *)((long)aVar32 + 4);
                    *(float *)(lVar9 + 8 + (ulong)uVar30 * 0xc) = paVar6[uVar43].z;
                    *(undefined8 *)(lVar9 + (ulong)uVar30 * 0xc) = *(undefined8 *)(paVar6 + uVar43);
                  }
                  lVar39 = lVar39 + 1;
                } while (lVar39 != 8);
                lVar39 = 0;
                do {
                  if ((pMesh->mColors[lVar39] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                    uVar11 = *(undefined8 *)&pMesh->mColors[lVar39][uVar43].b;
                    puVar3 = (undefined8 *)
                             (*(long *)((uint *)((long)aVar32 + 0x30) + lVar39 * 2) +
                             (ulong)*(uint *)((long)aVar32 + 4) * 0x10);
                    *puVar3 = *(undefined8 *)(pMesh->mColors[lVar39] + uVar43);
                    puVar3[1] = uVar11;
                  }
                  lVar39 = lVar39 + 1;
                } while (lVar39 != 8);
                paVar27[-1].mIndices[uVar38] = *(uint *)((long)aVar32 + 4);
                if (pVVar31 != (VertexWeightTable *)0x0) {
                  uVar30 = *(uint *)((long)aVar32 + 4);
                  ppVar40 = pVVar31[uVar30].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (ppVar40 !=
                      pVVar31[uVar30].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    for (; ppVar40 !=
                           pVVar31[uVar30].
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish; ppVar40 = ppVar40 + 1) {
                      lVar39 = *(long *)puVar2;
                      this_00 = *(vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> **)
                                 (lVar39 + (ulong)ppVar40->first * 8);
                      if (this_00 == (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)0x0)
                      {
                        this_00 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                                  operator_new(0x18);
                        (this_00->
                        super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl
                        .super__Vector_impl_data._M_start = (pointer)0x0;
                        (this_00->
                        super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl
                        .super__Vector_impl_data._M_finish = (pointer)0x0;
                        (this_00->
                        super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl
                        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        *(vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> **)
                         (lVar39 + (ulong)ppVar40->first * 8) = this_00;
                      }
                      local_438._4_4_ = ppVar40->second;
                      local_438._0_4_ = *(uint *)((long)aVar32 + 4);
                      __position._M_current =
                           (this_00->
                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                      if (__position._M_current ==
                          (this_00->
                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                        _M_realloc_insert<aiVertexWeight>
                                  (this_00,__position,(aiVertexWeight *)local_438);
                      }
                      else {
                        (__position._M_current)->mVertexId = *(uint *)((long)aVar32 + 4);
                        (__position._M_current)->mWeight = (float)local_438._4_4_;
                        ppaVar1 = &(this_00->
                                   super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                        *ppaVar1 = *ppaVar1 + 1;
                      }
                    }
                  }
                }
                local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar43] = *(uint *)((long)aVar32 + 4);
                *(uint *)((long)aVar32 + 4) = *(uint *)((long)aVar32 + 4) + 1;
              }
              else {
                paVar27[-1].mIndices[uVar38] =
                     local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar43];
              }
              uVar38 = uVar38 + 1;
            } while (uVar38 != uVar41);
          }
          uVar42 = (ulong)((uint)uVar42 + 1);
          bVar44 = *(uint *)((long)aVar32 + 4) != uVar5;
        }
      } while (bVar44);
      uVar43 = (uint)uVar42;
      if (((pMesh->mBones != (aiBone **)0x0) && (pMesh->mNumBones != 0)) && (pMesh->mNumBones != 0))
      {
        local_4c8 = *(undefined8 **)((long)aVar32 + 0xe0);
        uVar42 = 0;
        do {
          plVar7 = *(long **)(*(long *)puVar2 + uVar42 * 8);
          if (plVar7 != (long *)0x0) {
            paVar8 = pMesh->mBones[uVar42];
            puVar34 = (uint *)operator_new(0x450);
            *puVar34 = 0;
            *(undefined1 *)(puVar34 + 1) = 0;
            memset((void *)((long)puVar34 + 5),0x1b,0x3ff);
            puVar34[0x101] = 0;
            puVar34[0x102] = 0;
            puVar34[0x103] = 0;
            puVar34[0x104] = 0x3f800000;
            puVar34[0x105] = 0;
            puVar34[0x106] = 0;
            puVar34[0x107] = 0;
            puVar34[0x108] = 0;
            puVar34[0x109] = 0x3f800000;
            puVar34[0x10a] = 0;
            puVar34[0x10b] = 0;
            puVar34[0x10c] = 0;
            puVar34[0x10d] = 0;
            puVar34[0x10e] = 0x3f800000;
            puVar34[0x10f] = 0;
            puVar34[0x110] = 0;
            puVar34[0x111] = 0;
            puVar34[0x112] = 0;
            puVar34[0x113] = 0x3f800000;
            *local_4c8 = puVar34;
            uVar5 = (paVar8->mName).length;
            if (0x3fe < uVar5) {
              uVar5 = 0x3ff;
            }
            uVar41 = (ulong)uVar5;
            local_438._0_4_ = uVar5;
            memcpy(local_438 + 4,(paVar8->mName).data,uVar41);
            local_438[uVar41 + 4] = 0;
            *puVar34 = uVar5;
            memcpy(puVar34 + 1,local_438 + 4,uVar41);
            *(undefined1 *)((long)puVar34 + uVar41 + 4) = 0;
            fVar23 = (paVar8->mOffsetMatrix).a1;
            fVar24 = (paVar8->mOffsetMatrix).a2;
            fVar25 = (paVar8->mOffsetMatrix).a3;
            fVar26 = (paVar8->mOffsetMatrix).a4;
            fVar19 = (paVar8->mOffsetMatrix).b1;
            fVar20 = (paVar8->mOffsetMatrix).b2;
            fVar21 = (paVar8->mOffsetMatrix).b3;
            fVar22 = (paVar8->mOffsetMatrix).b4;
            fVar15 = (paVar8->mOffsetMatrix).c1;
            fVar16 = (paVar8->mOffsetMatrix).c2;
            fVar17 = (paVar8->mOffsetMatrix).c3;
            fVar18 = (paVar8->mOffsetMatrix).c4;
            fVar12 = (paVar8->mOffsetMatrix).d2;
            fVar13 = (paVar8->mOffsetMatrix).d3;
            fVar14 = (paVar8->mOffsetMatrix).d4;
            puVar34[0x110] = (uint)(paVar8->mOffsetMatrix).d1;
            puVar34[0x111] = (uint)fVar12;
            puVar34[0x112] = (uint)fVar13;
            puVar34[0x113] = (uint)fVar14;
            puVar34[0x10c] = (uint)fVar15;
            puVar34[0x10d] = (uint)fVar16;
            puVar34[0x10e] = (uint)fVar17;
            puVar34[0x10f] = (uint)fVar18;
            puVar34[0x108] = (uint)fVar19;
            puVar34[0x109] = (uint)fVar20;
            puVar34[0x10a] = (uint)fVar21;
            puVar34[0x10b] = (uint)fVar22;
            puVar34[0x104] = (uint)fVar23;
            puVar34[0x105] = (uint)fVar24;
            puVar34[0x106] = (uint)fVar25;
            puVar34[0x107] = (uint)fVar26;
            lVar39 = plVar7[1];
            lVar9 = *plVar7;
            uVar38 = lVar39 - lVar9 >> 3;
            puVar34[0x101] = (uint)uVar38;
            uVar38 = uVar38 & 0xffffffff;
            uVar41 = uVar38 * 8;
            pvVar33 = operator_new__(uVar41);
            if (uVar38 != 0) {
              memset(pvVar33,0,uVar41);
            }
            *(void **)(puVar34 + 0x102) = pvVar33;
            memcpy(pvVar33,(void *)*plVar7,lVar39 - lVar9 & 0x7fffffff8);
            if ((void *)*plVar7 != (void *)0x0) {
              operator_delete((void *)*plVar7);
            }
            local_4c8 = local_4c8 + 1;
            operator_delete(plVar7);
            *(uint *)((long)aVar32 + 0xd8) = *(uint *)((long)aVar32 + 0xd8) + 1;
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 < pMesh->mNumBones);
      }
      paVar28 = local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish;
      paVar27 = local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar42 = (long)local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar41 = (long)uVar42 >> 4;
      puVar35 = (ulong *)operator_new__(-(ulong)(uVar41 >> 0x3c != 0) | uVar42 | 8);
      *puVar35 = uVar41;
      puVar35 = puVar35 + 1;
      if (paVar28 != paVar27) {
        puVar37 = puVar35;
        do {
          *(undefined4 *)puVar37 = 0;
          puVar37[1] = 0;
          puVar37 = puVar37 + 2;
        } while (puVar37 != (ulong *)(uVar42 + (long)puVar35));
      }
      *(ulong **)((long)aVar32 + 0xd0) = puVar35;
      *(uint *)((long)aVar32 + 8) = (uint)uVar41;
      if ((uint)uVar41 != 0) {
        lVar39 = 0;
        uVar42 = 0;
        do {
          aiFace::operator=((aiFace *)(*(long *)((long)aVar32 + 0xd0) + lVar39),
                            (aiFace *)
                            ((long)&(local_498.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->mNumIndices + lVar39
                            ));
          uVar42 = uVar42 + 1;
          lVar39 = lVar39 + 0x10;
        } while (uVar42 < *(uint *)((long)aVar32 + 8));
      }
      puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
      iVar10._M_current = *(pair<aiMesh_*,_unsigned_int> **)(local_450 + 8);
      local_438 = (undefined1  [8])aVar32;
      if (iVar10._M_current == *(pair<aiMesh_*,_unsigned_int> **)(local_450 + 0x10)) {
        std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
        ::_M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                  (local_450,iVar10,(pair<aiMesh_*,_unsigned_int> *)local_438);
      }
      else {
        (iVar10._M_current)->first = (aiMesh *)aVar32;
        *(uint **)&(iVar10._M_current)->second = puStack_430;
        *(long *)(local_450 + 8) = *(long *)(local_450 + 8) + 0x10;
      }
      uVar5 = pMesh->mNumFaces;
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_498);
    } while (uVar43 != uVar5);
    if (pVVar31 != (VertexWeightTable *)0x0) {
      ppVar40 = pVVar31[-1].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (ppVar40 != (pointer)0x0) {
        lVar39 = (long)ppVar40 * 0x18;
        do {
          pvVar33 = *(void **)((long)&pVVar31[-1].
                                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar39);
          if (pvVar33 != (void *)0x0) {
            operator_delete(pvVar33);
          }
          lVar39 = lVar39 + -0x18;
        } while (lVar39 != 0);
      }
      operator_delete__(&pVVar31[-1].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (pMesh != (aiMesh *)0x0) {
      aiMesh::~aiMesh(pMesh);
      operator_delete(pMesh);
    }
    if (local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
    iVar10._M_current =
         (avList->
         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (avList->
        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_438 = (undefined1  [8])pMesh;
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                  *)avList,iVar10,(pair<aiMesh_*,_unsigned_int> *)local_438);
    }
    else {
      (iVar10._M_current)->first = pMesh;
      *(uint **)&(iVar10._M_current)->second = puStack_430;
      pppVar4 = &(avList->
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar4 = *pppVar4 + 1;
    }
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Vertex::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumVertices > SplitLargeMeshesProcess_Vertex::LIMIT) {
        typedef std::vector< std::pair<unsigned int,float> > VertexWeightTable;

        // build a per-vertex weight list if necessary
        VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(pMesh);

        // we need to split this mesh into sub meshes
        // determine the estimated size of a submesh
        // (this could be too large. Max waste is a single digit percentage)
        const unsigned int iSubMeshes = (pMesh->mNumVertices / SplitLargeMeshesProcess_Vertex::LIMIT) + 1;

        // create a std::vector<unsigned int> to indicate which vertices
        // have already been copied
        std::vector<unsigned int> avWasCopied;
        avWasCopied.resize(pMesh->mNumVertices,0xFFFFFFFF);

        // try to find a good estimate for the number of output faces
        // per mesh. Add 12.5% as buffer
        unsigned int iEstimatedSize = pMesh->mNumFaces / iSubMeshes;
        iEstimatedSize += iEstimatedSize >> 3;

        // now generate all submeshes
        unsigned int iBase( 0 );
        while (true) {
            const unsigned int iOutVertexNum = SplitLargeMeshesProcess_Vertex::LIMIT;
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumVertices    = 0;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            typedef std::vector<aiVertexWeight> BoneWeightList;
            if (pMesh->HasBones()) {
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];
                ::memset(pcMesh->mBones,0,sizeof(void*)*pMesh->mNumBones);
            }

            // clear the temporary helper array
            if (iBase) {
                // we can't use memset here we unsigned int needn' be 32 bits
                for (auto &elem : avWasCopied) {
                    elem = 0xffffffff;
                }
            }

            // output vectors
            std::vector<aiFace> vFaces;

            // reserve enough storage for most cases
            if (pMesh->HasPositions()) {
                pcMesh->mVertices = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iOutVertexNum];
                pcMesh->mBitangents = new aiVector3D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasVertexColors(c);++c) {
                pcMesh->mColors[c] = new aiColor4D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasTextureCoords(c);++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                pcMesh->mTextureCoords[c] = new aiVector3D[iOutVertexNum];
            }
            vFaces.reserve(iEstimatedSize);

            // (we will also need to copy the array of indices)
            while (iBase < pMesh->mNumFaces) {
                // allocate a new array
                const unsigned int iNumIndices = pMesh->mFaces[iBase].mNumIndices;

                // doesn't catch degenerates but is quite fast
                unsigned int iNeed = 0;
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF == avWasCopied[iIndex]) {
                        iNeed++;
                    }
                }
                if (pcMesh->mNumVertices + iNeed > iOutVertexNum) {
                    // don't use this face
                    break;
                }

                vFaces.push_back(aiFace());
                aiFace& rFace = vFaces.back();

                // setup face type and number of indices
                rFace.mNumIndices = iNumIndices;
                rFace.mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (rFace.mNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF != avWasCopied[iIndex]) {
                        rFace.mIndices[v] = avWasCopied[iIndex];
                        continue;
                    }

                    // copy positions
                    pcMesh->mVertices[pcMesh->mNumVertices] = (pMesh->mVertices[iIndex]);

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[pcMesh->mNumVertices] = (pMesh->mNormals[iIndex]);
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[pcMesh->mNumVertices] = (pMesh->mTangents[iIndex]);
                        pcMesh->mBitangents[pcMesh->mNumVertices] = (pMesh->mBitangents[iIndex]);
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c)) {
                            pcMesh->mTextureCoords[c][pcMesh->mNumVertices] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][pcMesh->mNumVertices] = pMesh->mColors[c][iIndex];
                        }
                    }
                    // check whether we have bone weights assigned to this vertex
                    rFace.mIndices[v] = pcMesh->mNumVertices;
                    if (avPerVertexWeights) {
                        VertexWeightTable& table = avPerVertexWeights[ pcMesh->mNumVertices ];
                        if( !table.empty() ) {
                            for (VertexWeightTable::const_iterator iter =  table.begin();
                                    iter != table.end();++iter) {
                                // allocate the bone weight array if necessary
                                BoneWeightList* pcWeightList = (BoneWeightList*)pcMesh->mBones[(*iter).first];
                                if (nullptr == pcWeightList) {
                                    pcMesh->mBones[(*iter).first] = (aiBone*)(pcWeightList = new BoneWeightList());
                                }
                                pcWeightList->push_back(aiVertexWeight(pcMesh->mNumVertices,(*iter).second));
                            }
                        }
                    }

                    avWasCopied[iIndex] = pcMesh->mNumVertices;
                    pcMesh->mNumVertices++;
                }
                ++iBase;
                if(pcMesh->mNumVertices == iOutVertexNum) {
                    // break here. The face is only added if it was complete
                    break;
                }
            }

            // check which bones we'll need to create for this submesh
            if (pMesh->HasBones()) {
                aiBone** ppCurrent = pcMesh->mBones;
                for (unsigned int k = 0; k < pMesh->mNumBones;++k) {
                    // check whether the bone is existing
                    BoneWeightList* pcWeightList;
                    if ((pcWeightList = (BoneWeightList*)pcMesh->mBones[k])) {
                        aiBone* pcOldBone = pMesh->mBones[k];
                        aiBone* pcOut( nullptr );
                        *ppCurrent++ = pcOut = new aiBone();
                        pcOut->mName = aiString(pcOldBone->mName);
                        pcOut->mOffsetMatrix = pcOldBone->mOffsetMatrix;
                        pcOut->mNumWeights = (unsigned int)pcWeightList->size();
                        pcOut->mWeights = new aiVertexWeight[pcOut->mNumWeights];

                        // copy the vertex weights
                        ::memcpy(pcOut->mWeights,&pcWeightList->operator[](0),
                            pcOut->mNumWeights * sizeof(aiVertexWeight));

                        // delete the temporary bone weight list
                        delete pcWeightList;
                        pcMesh->mNumBones++;
                    }
                }
            }

            // copy the face list to the mesh
            pcMesh->mFaces = new aiFace[vFaces.size()];
            pcMesh->mNumFaces = (unsigned int)vFaces.size();

            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p] = vFaces[p];
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));

            if (iBase == pMesh->mNumFaces) {
                // have all faces ... finish the outer loop, too
                break;
            }
        }

        // delete the per-vertex weight list again
        delete[] avPerVertexWeights;

        // now delete the old mesh data
        delete pMesh;
        return;
    }
    avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
}